

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O1

void __thiscall CVmImageLoader::load_srcfiles(CVmImageLoader *this,ulong siz)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  undefined4 extraout_var;
  CVmSrcfEntry *this_00;
  undefined4 extraout_var_00;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong name_len;
  bool bVar10;
  char buf [64];
  undefined4 local_78;
  undefined4 local_74;
  
  if (G_srcf_table_X == (CVmSrcfTable *)0x0) {
    (*this->fp_->_vptr_CVmImageFile[9])(this->fp_,siz);
    return;
  }
  CVmSrcfTable::clear(G_srcf_table_X);
  if (siz < 4) {
LAB_0029d866:
    err_throw(0x132);
  }
  (*this->fp_->_vptr_CVmImageFile[3])(this->fp_,&local_78,4);
  uVar4 = (ulong)(ushort)local_78;
  if (uVar4 != 0) {
    uVar8 = (ulong)local_78._2_2_;
    uVar6 = siz - 4;
    uVar1 = (uint)local_78._2_2_;
    uVar5 = 0;
    do {
      iVar2 = (*this->fp_->_vptr_CVmImageFile[8])();
      if (uVar6 < 8) goto LAB_0029d866;
      (*this->fp_->_vptr_CVmImageFile[3])(this->fp_,&local_78,8);
      name_len = (ulong)local_74._2_2_;
      uVar9 = (ulong)local_78;
      this_00 = CVmSrcfTable::add_entry(G_srcf_table_X,local_74 & 0xffff,name_len);
      uVar7 = (uVar6 - 8) - name_len;
      if (uVar6 - 8 < name_len) goto LAB_0029d866;
      (*this->fp_->_vptr_CVmImageFile[3])(this->fp_,this_00->name_buf_,name_len);
      this_00->name_buf_[name_len] = '\0';
      if (uVar7 < 4) goto LAB_0029d866;
      uVar6 = uVar7 - 4;
      (*this->fp_->_vptr_CVmImageFile[3])(this->fp_,&local_78,4);
      if (uVar1 - 8 < 0x39) {
        uVar7 = (ulong)local_78;
        CVmSrcfEntry::alloc_line_records(this_00,uVar7);
        for (; uVar7 != 0; uVar7 = uVar7 - 1) {
          bVar10 = uVar6 < uVar8;
          uVar6 = uVar6 - uVar8;
          if (bVar10) goto LAB_0029d866;
          (*this->fp_->_vptr_CVmImageFile[3])(this->fp_,&local_78,uVar8);
          CVmSrcfEntry::add_line_record(this_00,(ulong)local_78,(ulong)local_74);
        }
      }
      iVar3 = (*this->fp_->_vptr_CVmImageFile[8])();
      uVar9 = (CONCAT44(extraout_var,iVar2) + uVar9) - CONCAT44(extraout_var_00,iVar3);
      if (uVar9 != 0) {
        bVar10 = uVar6 < uVar9;
        uVar6 = uVar6 - uVar9;
        if (bVar10) goto LAB_0029d866;
        (*this->fp_->_vptr_CVmImageFile[9])(this->fp_,uVar9);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != uVar4);
  }
  return;
}

Assistant:

void CVmImageLoader::load_srcfiles(VMG_ ulong siz)
{
    size_t i;
    char buf[64];
    size_t entry_cnt;
    size_t line_size;

    /* 
     *   if there's no source file table, we're not in debug mode and hence
     *   have no use for this type of information, so skip the block 
     */
    if (G_srcf_table == 0)
    {
        /* skip the entire block in the file */
        fp_->skip_ahead(siz);

        /* we're done */
        return;
    }

    /* clear any existing information in the table */
    G_srcf_table->clear();

    /* read the number of entries in the table, and the line record size */
    read_data(buf, 4, &siz);
    entry_cnt = osrp2(buf);
    line_size = osrp2(buf + 2);

    /* read the entries */
    for (i = 0 ; i < entry_cnt ; ++i)
    {
        long start_pos;
        long next_pos;
        int orig_index;
        size_t len;
        CVmSrcfEntry *entry;
        ulong line_cnt;
        ulong skip_amt;

        /* note the starting file location of this record */
        start_pos = fp_->get_seek();

        /* 
         *   read the size of this file record, the original index, and the
         *   length of the filename 
         */
        read_data(buf, 8, &siz);
        orig_index = osrp2(buf + 4);
        len = osrp2(buf + 6);

        /* 
         *   calculate the file location of the start of the next block by
         *   adding the starting position and size of this block 
         */
        next_pos = start_pos + t3rp4u(buf);

        /* allocate the entry */
        entry = G_srcf_table->add_entry(orig_index, len);

        /* read the data into this entry's buffer */
        read_data(entry->get_name_buf(), len, &siz);

        /* null-terminate the buffer */
        entry->get_name_buf()[len] = '\0';

        /* read the number of line records */
        read_data(buf, 4, &siz);
        line_cnt = t3rp4u(buf);

        /* 
         *   if the line records are too big for our buffer, or smaller than
         *   our required minimum size, don't bother reading them - we'll
         *   just skip them entirely 
         */
        if (line_size <= sizeof(buf) && line_size >= 8)
        {
            /* tell the source file table entry how many lines we have */
            entry->alloc_line_records(line_cnt);

            /* read the line records */
            for ( ; line_cnt != 0 ; --line_cnt)
            {
                ulong linenum;
                ulong code_addr;

                /* read the record */
                read_data(buf, line_size, &siz);

                /* get the source line number and byte code offset */
                linenum = t3rp4u(buf);
                code_addr = t3rp4u(buf + 4);

                /* add the line to the source file table entry */
                entry->add_line_record(linenum, code_addr);
            }
        }

        /* skip ahead to the start of the next record */
        skip_amt = next_pos - fp_->get_seek();
        if (skip_amt != 0)
            skip_data(skip_amt, &siz);
    }
}